

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema.c++
# Opt level: O0

Type __thiscall capnp::ConstSchema::getType(ConstSchema *this)

{
  Reader proto;
  uint location;
  Type TVar1;
  Reader local_b0;
  Reader local_80;
  Reader local_50;
  ConstSchema *local_20;
  ConstSchema *this_local;
  
  local_20 = this;
  Schema::getProto(&local_b0,&this->super_Schema);
  capnp::schema::Node::Reader::getConst(&local_80,&local_b0);
  capnp::schema::Node::Const::Reader::getType(&local_50,&local_80);
  location = _::RawBrandedSchema::makeDepLocation(CONST_TYPE,0);
  proto._reader.capTable = local_50._reader.capTable;
  proto._reader.segment = local_50._reader.segment;
  proto._reader.data = local_50._reader.data;
  proto._reader.pointers = local_50._reader.pointers;
  proto._reader.dataSize = local_50._reader.dataSize;
  proto._reader.pointerCount = local_50._reader.pointerCount;
  proto._reader._38_2_ = local_50._reader._38_2_;
  proto._reader.nestingLimit = local_50._reader.nestingLimit;
  proto._reader._44_4_ = local_50._reader._44_4_;
  TVar1 = Schema::interpretType(&this->super_Schema,proto,location);
  return TVar1;
}

Assistant:

Type ConstSchema::getType() const {
  return interpretType(getProto().getConst().getType(),
      _::RawBrandedSchema::makeDepLocation(_::RawBrandedSchema::DepKind::CONST_TYPE, 0));
}